

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  size_t *this;
  anon_class_8_1_3fcf653c local_3c8;
  Handler local_3c0;
  anon_class_8_1_3fcf653c local_3a0;
  Handler local_398;
  anon_class_16_2_f9f04af6 local_378;
  Handler local_368;
  anon_class_8_1_3fcf653c local_348;
  Handler local_340;
  anon_class_1_0_00000001 local_309;
  Handler local_308;
  size_t local_2e8;
  size_t id;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  db;
  Server svr;
  
  this = &db._M_t._M_impl.super__Rb_tree_header._M_node_count;
  httplib::Server::Server((Server *)this);
  std::
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&id);
  local_2e8 = 0;
  std::function<void(httplib::Request_const&,httplib::Response&)>::function<main::__0,void>
            ((function<void(httplib::Request_const&,httplib::Response&)> *)&local_308,&local_309);
  httplib::Server::Get((Server *)this,"/",&local_308);
  std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::~function(&local_308);
  local_348.db = (map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&id;
  std::function<void(httplib::Request_const&,httplib::Response&)>::function<main::__1,void>
            ((function<void(httplib::Request_const&,httplib::Response&)> *)&local_340,&local_348);
  httplib::Server::Get
            ((Server *)&db._M_t._M_impl.super__Rb_tree_header._M_node_count,"/msg/(\\d+)",&local_340
            );
  std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::~function(&local_340);
  local_378.db = (map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&id;
  local_378.id = &local_2e8;
  std::function<void(httplib::Request_const&,httplib::Response&)>::function<main::__2,void>
            ((function<void(httplib::Request_const&,httplib::Response&)> *)&local_368,&local_378);
  httplib::Server::Post
            ((Server *)&db._M_t._M_impl.super__Rb_tree_header._M_node_count,"/",&local_368);
  std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::~function(&local_368);
  local_3a0.db = (map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&id;
  std::function<void(httplib::Request_const&,httplib::Response&)>::function<main::__3,void>
            ((function<void(httplib::Request_const&,httplib::Response&)> *)&local_398,&local_3a0);
  httplib::Server::Patch
            ((Server *)&db._M_t._M_impl.super__Rb_tree_header._M_node_count,"/",&local_398);
  std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::~function(&local_398);
  local_3c8.db = (map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&id;
  std::function<void(httplib::Request_const&,httplib::Response&)>::function<main::__4,void>
            ((function<void(httplib::Request_const&,httplib::Response&)> *)&local_3c0,&local_3c8);
  httplib::Server::Delete
            ((Server *)&db._M_t._M_impl.super__Rb_tree_header._M_node_count,"/msg/(\\d+)",&local_3c0
            );
  std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::~function(&local_3c0);
  httplib::Server::listen
            ((Server *)&db._M_t._M_impl.super__Rb_tree_header._M_node_count,0x18544b,0x1f90);
  std::
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&id);
  httplib::Server::~Server((Server *)&db._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return 0;
}

Assistant:

int main(void)
{
	httplib::Server svr;

	std::map<size_t, std::string> db;
	size_t id = 0;

	svr.Get("/", [](const httplib::Request&, httplib::Response& res)
		{
			res.set_content("Hello World!", "text/plain");
		});

	svr.Get(R"(/msg/(\d+))", [&](const httplib::Request& req, httplib::Response& res)
		{
			auto n = req.matches[1];

			nlohmann::json jRes;

			try
			{
				jRes["id"] = std::stoi(n);
				jRes["msg"] = db[std::stoi(n)];

				res.set_content(jRes.dump(), "application/json");
			}
			catch (const std::exception&)
			{
				res.set_content("Cannot find the requested message.", "text/plain");
			}

		});

	svr.Post("/", [&](const httplib::Request& req, httplib::Response& res)
		{
			nlohmann::json json = nlohmann::json::parse(req.body);

			if (bValidReq(json, { "msg" }))
			{
				db.insert({ id, json["msg"] });

				nlohmann::json jRes;

				jRes["id"] = id;
				jRes["msg"] = db[id];

				id++;

				res.set_content(jRes.dump(), "application/json");
			}
			else
				res.set_content("The request doesn't meet the requirements", "text/plain");

		});

	svr.Patch("/", [&](const httplib::Request& req, httplib::Response& res)
		{
			nlohmann::json json = nlohmann::json::parse(req.body);

			if (bValidReq(json, { "id", "msg" }))
			{
				db[json["id"]] = json["msg"];

				nlohmann::json jRes;

				jRes["id"] = json["id"];
				jRes["msg"] = db[json["id"]];

				res.set_content(jRes.dump(), "application/json");
			}
			else
				res.set_content("The request doesn't meet the requirements", "text/plain");

		});

	svr.Delete(R"(/msg/(\d+))", [&](const httplib::Request& req, httplib::Response& res)
		{

			auto n = req.matches[1];

			db[std::stoi(n)] = "deleted";

			nlohmann::json jRes;

			jRes["id"] = std::stoi(n);
			jRes["msg"] = "deleted";

			res.set_content(jRes.dump(), "application/json");

		});


	svr.listen("0.0.0.0", 8080);
	return 0;
}